

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O0

bool __thiscall
HawkTracer::parser::ProtocolReader::_read_string(ProtocolReader *this,FieldType *value)

{
  int iVar1;
  void *pvVar2;
  pointer pSVar3;
  bad_alloc *pbVar4;
  char *pcVar5;
  void *tmp_1;
  int c;
  void *tmp;
  char *data;
  size_t pos;
  size_t length;
  FieldType *value_local;
  ProtocolReader *this_local;
  
  pos = 0x20;
  data = (char *)0x0;
  pvVar2 = malloc(0x20);
  if (pvVar2 == (void *)0x0) {
    pbVar4 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(pbVar4);
    __cxa_throw(pbVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  do {
    do {
      tmp = pvVar2;
      pSVar3 = std::
               unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
               ::operator->(&this->_stream);
      iVar1 = (*pSVar3->_vptr_Stream[2])();
      if (iVar1 < 1) {
        if (-1 < iVar1) {
          *(char *)((long)tmp + (long)data) = '\0';
          value->f_POINTER = tmp;
        }
        else {
          free(tmp);
        }
        return -1 < iVar1;
      }
      pcVar5 = data + 1;
      *(char *)((long)tmp + (long)data) = (char)iVar1;
      pvVar2 = tmp;
      data = pcVar5;
    } while (pcVar5 != (char *)pos);
    pos = pos << 1;
    pvVar2 = realloc(tmp,pos);
  } while (pvVar2 != (void *)0x0);
  free(tmp);
  pbVar4 = (bad_alloc *)__cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(pbVar4);
  __cxa_throw(pbVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

bool ProtocolReader::_read_string(FieldType& value)
{
    size_t length = 32;
    size_t pos = 0;
    char* data;

    if (void *tmp = std::malloc(length))
    {
        data = static_cast<char*>(tmp);
    }
    else
    {
        throw std::bad_alloc();
    }

    int c;
    while ((c = _stream->read_byte()) > 0)
    {
        data[pos++] = (char)c;
        if (pos == length)
        {
            length *= 2;
            if (void *tmp = std::realloc(data, length))
            {
                data = static_cast<char*>(tmp);
            }
            else
            {
                std::free(data);
                throw std::bad_alloc();
            }
        }
    }
    if (c < 0)
    {
        std::free(data);
        return false;
    }

    data[pos] = 0;
    value.f_STRING = data;
    return true;
}